

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

void refs_down(refs_table_t *tbl,uint64_t a)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  
  do {
    while (uVar3 = tbl->refs_control, 0xfffffff < uVar3) {
      do {
        iVar8 = refs_resize_help(tbl);
      } while (iVar8 != 0);
    }
    LOCK();
    bVar9 = uVar3 == tbl->refs_control;
    if (bVar9) {
      tbl->refs_control = uVar3 + 1;
    }
    UNLOCK();
  } while (!bVar9);
  uVar5 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
  uVar6 = a | 0x10000000000;
  puVar7 = tbl->refs_table + (tbl->refs_size - 1 & (uVar5 >> 0x20 ^ uVar5));
  iVar8 = 0x7f;
  do {
    while( true ) {
      uVar5 = *puVar7;
      bVar9 = true;
      if (uVar5 == 0) goto LAB_0012b87c;
      if ((uVar5 != 0x7fffffffffffffff) && ((uVar5 & 0xffffffffff) == a)) break;
      puVar7 = puVar7 + 1;
      if (puVar7 == tbl->refs_table + tbl->refs_size) {
        puVar7 = tbl->refs_table;
      }
      bVar10 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar10) goto LAB_0012b87c;
    }
    if ((uVar5 >> 0x28 != 0x7fffff) &&
       (lVar1 = (uVar5 >> 0x28) - 1, uVar6 = lVar1 << 0x28 | a, lVar1 == 0)) {
      uVar6 = 0x7fffffffffffffff;
    }
    if ((uint)(uVar5 >> 0x28) == 0x7fffff) break;
    LOCK();
    uVar2 = *puVar7;
    if (uVar5 == uVar2) {
      *puVar7 = uVar6;
    }
    UNLOCK();
  } while (uVar5 != uVar2);
  bVar9 = false;
LAB_0012b87c:
  do {
    uVar4 = tbl->refs_control;
    LOCK();
    bVar10 = uVar4 == tbl->refs_control;
    if (bVar10) {
      tbl->refs_control = uVar4 - 1;
    }
    UNLOCK();
  } while (!bVar10);
  if (bVar9) {
    __assert_fail("res != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                  ,0x107,"void refs_down(refs_table_t *, uint64_t)");
  }
  return;
}

Assistant:

void
refs_down(refs_table_t *tbl, uint64_t a)
{
#ifdef NDEBUG
    refs_modify(tbl, a, -1);
#else
    int res = refs_modify(tbl, a, -1);
    assert(res != 0);
#endif
}